

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,FunctionStmtBlock *stmt)

{
  add_info(this,(Stmt *)stmt);
  return;
}

Assistant:

void inline visit(FunctionStmtBlock *stmt) override { add_info(stmt); }